

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseExpression(StructuralParser *this,bool allowAssignment)

{
  bool bVar1;
  Assignment *args_1;
  Expression *pEVar2;
  Op OStack_60;
  Context context;
  
  args_1 = (Assignment *)parseTernaryOperator(this);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x274473);
  if (bVar1) {
    OStack_60 = add;
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x2971e6);
    if (bVar1) {
      OStack_60 = subtract;
    }
    else {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x2971e9);
      if (bVar1) {
        OStack_60 = multiply;
      }
      else {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x2971ec);
        if (bVar1) {
          OStack_60 = divide;
        }
        else {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)0x2971ef);
          if (bVar1) {
            OStack_60 = modulo;
          }
          else {
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matches(&this->super_SOULTokeniser,(TokenType)0x2971f2);
            if (bVar1) {
              OStack_60 = leftShift;
            }
            else {
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matches(&this->super_SOULTokeniser,(TokenType)0x2971f7);
              if (bVar1) {
                OStack_60 = rightShift;
              }
              else {
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)0x2971f6);
                if (bVar1) {
                  OStack_60 = rightShiftUnsigned;
                }
                else {
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)0x2971fb);
                  if (bVar1) {
                    OStack_60 = bitwiseXor;
                  }
                  else {
                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matches(&this->super_SOULTokeniser,(TokenType)0x2971ff);
                    if (bVar1) {
                      OStack_60 = bitwiseAnd;
                    }
                    else {
                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matches(&this->super_SOULTokeniser,(TokenType)0x297203);
                      if (bVar1) {
                        OStack_60 = bitwiseOr;
                      }
                      else {
                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                ::matches(&this->super_SOULTokeniser,(TokenType)0x2971fe);
                        if (bVar1) {
                          OStack_60 = logicalAnd;
                        }
                        else {
                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  ::matches(&this->super_SOULTokeniser,(TokenType)0x297202);
                          if (!bVar1) {
                            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    ::matchIf<soul::TokenType>
                                              (&this->super_SOULTokeniser,(TokenType)0x275da6);
                            if (bVar1) {
                              if (!allowAssignment) {
                                Errors::assignmentInsideExpression<>();
                                (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&context);
                                CompileMessage::~CompileMessage((CompileMessage *)&context);
                              }
                              getContext(&context,this);
                              pEVar2 = parseExpression(this,false);
                              args_1 = allocate<soul::AST::Assignment,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                                                 (this,&context,(Expression *)args_1,pEVar2);
                              RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                                        ((RefCountedPtr<soul::SourceCodeText> *)&context);
                            }
                            return &args_1->super_Expression;
                          }
                          OStack_60 = logicalOr;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pEVar2 = parseInPlaceOpExpression(this,allowAssignment,(Expression *)args_1,OStack_60);
  return pEVar2;
}

Assistant:

AST::Expression& parseExpression (bool allowAssignment = false)
    {
        auto& lhs = parseTernaryOperator();

        if (matches (Operator::plusEquals))                 return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::add);
        if (matches (Operator::minusEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::subtract);
        if (matches (Operator::timesEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::multiply);
        if (matches (Operator::divideEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::divide);
        if (matches (Operator::moduloEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::modulo);
        if (matches (Operator::leftShiftEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::leftShift);
        if (matches (Operator::rightShiftEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShift);
        if (matches (Operator::rightShiftUnsignedEquals))   return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShiftUnsigned);
        if (matches (Operator::xorEquals))                  return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseXor);
        if (matches (Operator::bitwiseAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseAnd);
        if (matches (Operator::bitwiseOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseOr);
        if (matches (Operator::logicalAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalAnd);
        if (matches (Operator::logicalOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalOr);

        if (matchIf (Operator::assign))
        {
            if (! allowAssignment)
                throwError (Errors::assignmentInsideExpression());

            auto context = getContext();
            return allocate<AST::Assignment> (context, lhs, parseExpression());
        }

        return lhs;
    }